

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_illegal_opcode(void)

{
  cio_error cVar1;
  undefined1 local_58 [4];
  cio_error err;
  ws_frame frames [2];
  undefined4 local_d;
  undefined1 local_9;
  char data [5];
  
  local_d = 0x61616161;
  local_9 = 0;
  local_58 = (undefined1  [4])0xb;
  err = CIO_SUCCESS;
  frames[0]._0_8_ = &local_d;
  frames[0].data = (void *)0x5;
  frames[0].data_length._0_1_ = 1;
  frames[0].data_length._1_1_ = 0;
  frames[0].last_frame = true;
  frames[0].rsv = false;
  frames[0]._26_2_ = 0;
  frames[0]._28_4_ = 0;
  frames[1].frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME;
  frames[1].direction = FROM_CLIENT;
  frames[1].data = (void *)0x0;
  frames[1].data_length._0_1_ = 1;
  frames[1].data_length._1_1_ = 0;
  serialize_frames((ws_frame *)local_58,2);
  *(ushort *)&(ws->ws_private).ws_flags =
       *(ushort *)&(ws->ws_private).ws_flags & 0xfbff | (ushort)(err == CIO_SUCCESS) << 10;
  cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x639,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,
             "number of read_handler callbacks called not correct",0x63b,UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg1_history[read_handler_fake.call_count - 1] == (void *)0x0) {
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_history[read_handler_fake.call_count - 1],
               "err parameter of read_handler not correct",0x63d,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was not called",0x63f,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "websocket parameter of on_error not correct",0x640,UNITY_DISPLAY_STYLE_HEX64);
    UnityAssertEqualNumber
              (-0x5d,(long)on_error_fake.arg1_val,"error code of on_error not correct",0x641,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_control_fake.call_count,"control callback was called for close frame",
               0x643,UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("context parameter of read_handler not correct",0x63c);
}

Assistant:

static void test_illegal_opcode(void)
{
	char data[] = "aaaa";

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_PONG_FRAME + 1, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "number of read_handler callbacks called not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[read_handler_fake.call_count - 1], "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[read_handler_fake.call_count - 1], "err parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");
	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, on_error_fake.arg0_val, "websocket parameter of on_error not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_PROTOCOL_NOT_SUPPORTED, on_error_fake.arg1_val, "error code of on_error not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.call_count, "control callback was called for close frame");
}